

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O2

void lore_show_subwindow(monster_race *race,monster_lore *lore)

{
  textblock *tb;
  wchar_t y;
  
  if ((race != (monster_race *)0x0) && (lore != (monster_lore *)0x0)) {
    for (y = L'\0'; y < Term->hgt; y = y + L'\x01') {
      Term_erase(L'\0',y,L'ÿ');
    }
    tb = textblock_new();
    lore_description(tb,race,lore,false);
    textui_textblock_place(tb,(region_conflict)ZEXT816(0),(char *)0x0);
    textblock_free(tb);
    return;
  }
  __assert_fail("race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-mon-lore.c"
                ,0xbf,
                "void lore_show_subwindow(const struct monster_race *, const struct monster_lore *)"
               );
}

Assistant:

void lore_show_subwindow(const struct monster_race *race,
						 const struct monster_lore *lore)
{
	int y;
	textblock *tb;

	assert(race && lore);

	/* Erase the window, since textui_textblock_place() only clears what it
	 * needs */
	for (y = 0; y < Term->hgt; y++)
		Term_erase(0, y, 255);

	tb = textblock_new();
	lore_description(tb, race, lore, false);
	textui_textblock_place(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}